

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O0

void Gia_IsoRecognizeMuxes(Gia_Man_t *pGia)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int local_34;
  Gia_Obj_t *pGStack_30;
  int i;
  Gia_Obj_t *pObj0;
  Gia_Obj_t *pObj1;
  Gia_Obj_t *pObjC;
  Gia_Obj_t *pObj;
  Gia_Man_t *pGia_local;
  
  local_34 = 0;
  pObj = (Gia_Obj_t *)pGia;
  while( true ) {
    bVar6 = false;
    if (local_34 < *(int *)(pObj + 2)) {
      pObjC = Gia_ManObj((Gia_Man_t *)pObj,local_34);
      bVar6 = pObjC != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar3 = Gia_ObjIsAnd(pObjC);
    if ((iVar3 != 0) && (iVar3 = Gia_ObjIsMuxType(pObjC), iVar3 != 0)) {
      pObj1 = Gia_ObjRecognizeMux(pObjC,&pObj0,&stack0xffffffffffffffd0);
      pGVar4 = Gia_Regular(pGStack_30);
      pGVar5 = Gia_Regular(pObj0);
      uVar2 = s_256Primes[0xeb];
      uVar1 = s_256Primes[0xe9];
      if (pGVar4 == pGVar5) {
        pGVar4 = Gia_Regular(pObjC);
        pGVar4->Value = uVar1 + pGVar4->Value;
        uVar1 = s_256Primes[0xea];
        pGVar4 = Gia_Regular(pObj1);
        pGVar4->Value = uVar1 + pGVar4->Value;
        uVar1 = s_256Primes[0xea];
        pGVar4 = Gia_Regular(pGStack_30);
        pGVar4->Value = uVar1 + pGVar4->Value;
      }
      else {
        pGVar4 = Gia_Regular(pObjC);
        pGVar4->Value = uVar2 + pGVar4->Value;
        uVar1 = s_256Primes[0xec];
        pGVar4 = Gia_Regular(pObj1);
        pGVar4->Value = uVar1 + pGVar4->Value;
        uVar1 = s_256Primes[0xed];
        pGVar4 = Gia_Regular(pGStack_30);
        pGVar4->Value = uVar1 + pGVar4->Value;
        uVar1 = s_256Primes[0xed];
        pGVar4 = Gia_Regular(pObj0);
        pGVar4->Value = uVar1 + pGVar4->Value;
      }
    }
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

void Gia_IsoRecognizeMuxes( Gia_Man_t * pGia )
{
    Gia_Obj_t * pObj, * pObjC, * pObj1, * pObj0;
    int i;
    Gia_ManForEachAnd( pGia, pObj, i )
    {
        if ( !Gia_ObjIsMuxType(pObj) )
            continue;
        pObjC = Gia_ObjRecognizeMux( pObj, &pObj1, &pObj0 );
        if ( Gia_Regular(pObj0) == Gia_Regular(pObj1) )
        {
            // this is XOR
            Gia_Regular(pObj)->Value += s_256Primes[233];
            Gia_Regular(pObjC)->Value += s_256Primes[234];
            Gia_Regular(pObj0)->Value += s_256Primes[234];
        }
        else
        {
            // this is MUX
            Gia_Regular(pObj)->Value += s_256Primes[235];
            Gia_Regular(pObjC)->Value += s_256Primes[236];
            Gia_Regular(pObj0)->Value += s_256Primes[237];
            Gia_Regular(pObj1)->Value += s_256Primes[237];
        }
    }
}